

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionKernel
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  uint *puVar1;
  uint *puVar2;
  pointer pEVar3;
  pointer pEVar4;
  _Alloc_hider __s1;
  bool bVar5;
  uint uVar6;
  uint id;
  int iVar7;
  Op OVar8;
  Instruction *pIVar9;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar10;
  _Rb_tree_node_base *p_Var11;
  Instruction *this;
  mapped_type *pmVar12;
  Instruction *in_RCX;
  uint *puVar13;
  long lVar14;
  pointer pEVar15;
  char *pcVar16;
  ulong uVar17;
  bool bVar18;
  string inst_name;
  string name_str;
  spv_result_t local_264;
  string local_250;
  Instruction *local_230;
  string local_228;
  DiagnosticStream local_208;
  
  (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)_,(ValidationState_t *)inst,in_RCX);
  uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  pIVar9 = ValidationState_t::FindDef(_,uVar6);
  if ((pIVar9->inst_).opcode == 0x36) {
    puVar1 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      bVar5 = false;
      do {
        puVar13 = puVar1 + 1;
        if (*puVar1 == uVar6) {
          bVar5 = true;
          break;
        }
        puVar1 = puVar13;
      } while (puVar13 != puVar2);
      if (((bVar5) &&
          (psVar10 = ValidationState_t::GetExecutionModels(_,uVar6),
          psVar10 !=
          (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
           *)0x0)) && ((psVar10->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        local_230 = inst;
        for (p_Var11 = (psVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            bVar5 = (_Rb_tree_header *)p_Var11 != &(psVar10->_M_t)._M_impl.super__Rb_tree_header,
            bVar5; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          if (p_Var11[1]._M_color != 5) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,local_230);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," must refer only to GLCompute entry-points",0x2a);
            local_264 = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            break;
          }
        }
        pIVar9 = local_230;
        if (bVar5) goto LAB_002eaacd;
        id = Instruction::GetOperandAs<unsigned_int>(local_230,5);
        this = ValidationState_t::FindDef(_,id);
        if ((this == (Instruction *)0x0) || ((this->inst_).opcode != 7)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar9);
          pcVar16 = "Name must be an OpString";
          lVar14 = 0x18;
          goto LAB_002eaab6;
        }
        Instruction::GetOperandAs<std::__cxx11::string>(&local_228,this,1);
        local_208._0_4_ = uVar6;
        pmVar12 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&_->entry_point_descriptions_,(key_type *)&local_208);
        __s1._M_p = local_228._M_dataplus._M_p;
        pEVar3 = (pmVar12->
                 super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pEVar4 = (pmVar12->
                 super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar3 == pEVar4) {
LAB_002eab22:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar9);
          pcVar16 = "Name must match an entry-point for Kernel";
          lVar14 = 0x29;
LAB_002eab48:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar16,lVar14);
          local_264 = local_208.error_;
          DiagnosticStream::~DiagnosticStream(&local_208);
        }
        else {
          bVar5 = false;
          do {
            pEVar15 = pEVar3 + 1;
            bVar18 = local_228._M_string_length == (pEVar3->name)._M_string_length;
            if (bVar18 && local_228._M_string_length != 0) {
              iVar7 = bcmp(__s1._M_p,(pEVar3->name)._M_dataplus._M_p,local_228._M_string_length);
              bVar18 = iVar7 == 0;
            }
            if (bVar18) {
              bVar5 = true;
              break;
            }
            pEVar3 = pEVar15;
          } while (pEVar15 != pEVar4);
          if (!bVar5) goto LAB_002eab22;
          uVar17 = (long)(pIVar9->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pIVar9->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          if ((version < 5) && (6 < uVar17)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Version ",8);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," of the ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
            pcVar16 = " instruction can only have 2 additional operands";
            lVar14 = 0x30;
            goto LAB_002eab48;
          }
          if (uVar17 < 7) {
LAB_002eabf7:
            if (7 < uVar17) {
              uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar9,7);
              bVar5 = IsUint32Constant(_,uVar6);
              if (!bVar5) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "Flags must be a 32-bit unsigned integer OpConstant",0x32);
                local_264 = local_208.error_;
                DiagnosticStream::~DiagnosticStream(&local_208);
                goto LAB_002eab63;
              }
            }
            if (8 < uVar17) {
              uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar9,8);
              OVar8 = ValidationState_t::GetIdOpcode(_,uVar6);
              if (OVar8 != OpString) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Attributes must be an OpString",0x1e);
                local_264 = local_208.error_;
                DiagnosticStream::~DiagnosticStream(&local_208);
                goto LAB_002eab63;
              }
            }
            local_264 = SPV_SUCCESS;
          }
          else {
            uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar9,6);
            bVar5 = IsUint32Constant(_,uVar6);
            if (bVar5) goto LAB_002eabf7;
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "NumArguments must be a 32-bit unsigned integer OpConstant",0x39);
            local_264 = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
          }
        }
LAB_002eab63:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002eaacd;
      }
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
    pcVar16 = " does not reference an entry-point";
    lVar14 = 0x22;
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
    pcVar16 = " does not reference a function";
    lVar14 = 0x1e;
  }
LAB_002eaab6:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar16,lVar14);
  DiagnosticStream::~DiagnosticStream(&local_208);
  local_264 = local_208.error_;
LAB_002eaacd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return local_264;
}

Assistant:

spv_result_t ValidateClspvReflectionKernel(ValidationState_t& _,
                                           const Instruction* inst,
                                           uint32_t version) {
  const auto inst_name = ReflectionInstructionName(_, inst);
  const auto kernel_id = inst->GetOperandAs<uint32_t>(4);
  const auto kernel = _.FindDef(kernel_id);
  if (kernel->opcode() != spv::Op::OpFunction) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference a function";
  }

  bool found_kernel = false;
  for (auto entry_point : _.entry_points()) {
    if (entry_point == kernel_id) {
      found_kernel = true;
      break;
    }
  }
  if (!found_kernel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference an entry-point";
  }

  const auto* exec_models = _.GetExecutionModels(kernel_id);
  if (!exec_models || exec_models->empty()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference an entry-point";
  }
  for (auto exec_model : *exec_models) {
    if (exec_model != spv::ExecutionModel::GLCompute) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << inst_name << " must refer only to GLCompute entry-points";
    }
  }

  auto name = _.FindDef(inst->GetOperandAs<uint32_t>(5));
  if (!name || name->opcode() != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Name must be an OpString";
  }

  const std::string name_str = name->GetOperandAs<std::string>(1);
  bool found = false;
  for (auto& desc : _.entry_point_descriptions(kernel_id)) {
    if (name_str == desc.name) {
      found = true;
      break;
    }
  }
  if (!found) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Name must match an entry-point for Kernel";
  }

  const auto num_operands = inst->operands().size();
  if (version < 5 && num_operands > 6) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Version " << version << " of the " << inst_name
           << " instruction can only have 2 additional operands";
  }

  if (num_operands > 6) {
    const auto num_args_id = inst->GetOperandAs<uint32_t>(6);
    if (!IsUint32Constant(_, num_args_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NumArguments must be a 32-bit unsigned integer OpConstant";
    }
  }

  if (num_operands > 7) {
    const auto flags_id = inst->GetOperandAs<uint32_t>(7);
    if (!IsUint32Constant(_, flags_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Flags must be a 32-bit unsigned integer OpConstant";
    }
  }

  if (num_operands > 8) {
    const auto atts_id = inst->GetOperandAs<uint32_t>(8);
    if (_.GetIdOpcode(atts_id) != spv::Op::OpString) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Attributes must be an OpString";
    }
  }

  return SPV_SUCCESS;
}